

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O1

vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
* get_1d_sincos_pos_embed_from_grid_new
            (vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
             *__return_storage_ptr__,int embed_dim,
            vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            *pos)

{
  pointer pfVar1;
  long lVar2;
  pointer pvVar3;
  pointer pvVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  float fVar9;
  float fVar10;
  double dVar11;
  vector<float,_std::allocator<float>_> omega;
  allocator_type local_bf;
  allocator_type local_be;
  allocator_type local_bd;
  uint local_bc;
  pointer local_b8;
  ulong local_b0;
  ulong local_a8;
  pointer local_a0;
  ulong local_98;
  ulong local_90;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *local_88;
  vector<float,_std::allocator<float>_> local_80;
  ulong local_68;
  vector<float,_std::allocator<float>_> local_60;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_48;
  
  local_b8 = (pos->
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  local_a0 = (pos->
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  pfVar1 = *(pointer *)
            ((long)&(local_b8->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data + 8);
  lVar2 = *(long *)&(local_b8->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data;
  uVar8 = (ulong)((uint)embed_dim >> 1);
  std::vector<float,_std::allocator<float>_>::vector(&local_80,uVar8,(allocator_type *)&local_48);
  local_bc = embed_dim;
  if (1 < (uint)embed_dim) {
    uVar6 = 0;
    do {
      dVar11 = pow(10000.0,(double)((float)(int)uVar6 / (float)((uint)embed_dim >> 1)));
      local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar6] = (float)(1.0 / dVar11);
      uVar6 = uVar6 + 1;
    } while (uVar8 != uVar6);
  }
  std::vector<float,_std::allocator<float>_>::vector(&local_60,(ulong)local_bc,&local_bd);
  local_98 = (ulong)((long)pfVar1 - lVar2) >> 2;
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector(&local_48,(long)(int)local_98,&local_60,&local_be);
  local_b0 = ((long)local_a0 - (long)local_b8 >> 3) * -0x5555555555555555;
  std::
  vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
  ::vector(__return_storage_ptr__,(long)(int)local_b0,&local_48,&local_bf);
  local_b8 = (pointer)__return_storage_ptr__;
  local_90 = uVar8;
  local_88 = pos;
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&local_48);
  if (local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pvVar3 = local_b8;
  if (0 < (int)local_b0) {
    local_b0 = local_b0 & 0x7fffffff;
    local_68 = local_98 & 0x7fffffff;
    uVar8 = local_90 * 4;
    local_a8 = 0;
    local_90 = uVar8;
    do {
      uVar6 = local_a8;
      if (0 < (int)local_98) {
        uVar5 = 0;
        do {
          if (1 < local_bc) {
            local_a0 = (pointer)(uVar5 * 0x18);
            uVar7 = 0;
            do {
              fVar9 = *(float *)(*(long *)&(local_88->
                                           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start[uVar6].
                                           super__Vector_base<float,_std::allocator<float>_>._M_impl
                                           .super__Vector_impl_data + uVar5 * 4) *
                      *(float *)((long)local_80.super__Vector_base<float,_std::allocator<float>_>.
                                       _M_impl.super__Vector_impl_data._M_start + uVar7);
              fVar10 = sinf(fVar9);
              pvVar4 = local_a0;
              *(float *)(*(long *)((long)&(local_a0->
                                          super__Vector_base<float,_std::allocator<float>_>)._M_impl
                                          .super__Vector_impl_data._M_start +
                                  *(long *)&(((_Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                                               *)&pvVar3->
                                                  super__Vector_base<float,_std::allocator<float>_>)
                                            ->_M_impl).super__Vector_impl_data._M_start[uVar6].
                                            super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                            ._M_impl.super__Vector_impl_data) + uVar7) = fVar10;
              fVar9 = cosf(fVar9);
              *(float *)(uVar7 + *(long *)((long)&(pvVar4->
                                                  super__Vector_base<float,_std::allocator<float>_>)
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                          *(long *)&(((
                                                  _Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                                                  *)&pvVar3->
                                                  super__Vector_base<float,_std::allocator<float>_>)
                                                  ->_M_impl).super__Vector_impl_data._M_start[uVar6]
                                                  .
                                                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                                  ._M_impl.super__Vector_impl_data) + uVar8) = fVar9
              ;
              uVar7 = uVar7 + 4;
            } while (uVar8 != uVar7);
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 != local_68);
      }
      local_a8 = local_a8 + 1;
    } while (local_a8 != local_b0);
  }
  if (local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return (vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
          *)local_b8;
}

Assistant:

static std::vector<std::vector<std::vector<float>>> get_1d_sincos_pos_embed_from_grid_new(int embed_dim, const std::vector<std::vector<float>> & pos) {
    assert(embed_dim % 2 == 0);
    int H = pos.size();
    int W = pos[0].size();

    std::vector<float> omega(embed_dim / 2);
    for (int i = 0; i < embed_dim / 2; ++i) {
        omega[i] = 1.0 / pow(10000.0, static_cast<float>(i) / (embed_dim / 2));
    }

    std::vector<std::vector<std::vector<float>>> emb(H, std::vector<std::vector<float>>(W, std::vector<float>(embed_dim)));
    for (int h = 0; h < H; ++h) {
        for (int w = 0; w < W; ++w) {
            for (int d = 0; d < embed_dim / 2; ++d) {
                float out_value = pos[h][w] * omega[d];
                emb[h][w][d] = sin(out_value);
                emb[h][w][d + embed_dim / 2] = cos(out_value);
            }
        }
    }

    return emb;
}